

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::InitBoxedInlineSegments<Js::JavascriptArray>
          (JavascriptArray *this,JavascriptArray *instance,bool deepCopy)

{
  InterruptPoller *pIVar1;
  SparseArraySegmentBase *pSVar2;
  code *pcVar3;
  bool bVar4;
  DynamicObjectFlags DVar5;
  SparseArraySegmentBase *pSVar6;
  undefined4 *puVar7;
  Recycler *pRVar8;
  SparseArraySegmentBase *pSVar9;
  undefined7 in_register_00000011;
  Type TVar10;
  Type *addr;
  undefined1 local_48 [8];
  AutoDisableInterrupt failFastError;
  
  failFastError._12_4_ = SUB84(CONCAT71(in_register_00000011,deepCopy),0);
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  DynamicObject::SetArrayFlags((DynamicObject *)this,DVar5 & ~HasSegmentMap);
  pSVar9 = (instance->head).ptr;
  TVar10 = pSVar9->size;
  bVar4 = IsInlineSegment(pSVar9,instance);
  if (bVar4) {
    pSVar6 = &DetermineInlineHeadSegmentPointer<Js::JavascriptArray,0u,true>(this)->
              super_SparseArraySegmentBase;
    TVar10 = pSVar9->length;
    pSVar6->left = pSVar9->left;
    pSVar6->length = TVar10;
    TVar10 = 0x40;
    if (pSVar9->size < 0x40) {
      TVar10 = pSVar9->size;
    }
    pSVar6->size = TVar10;
  }
  else {
    pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    pSVar6 = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                        (pRVar8,pSVar9->left,pSVar9->length,pSVar9->size,(pSVar9->next).ptr)->
              super_SparseArraySegmentBase;
  }
  SetHeadAndLastUsedSegment(this,pSVar6);
  SparseArraySegmentBase::CheckLengthvsSize(pSVar6);
  bVar4 = IsInlineSegment(pSVar9,instance);
  if (bVar4) {
    bVar4 = IsInlineSegment(pSVar6,this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2f06,
                                  "(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)))"
                                  ,
                                  "!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this))"
                                 );
      if (!bVar4) goto LAB_00b9cf8e;
      *puVar7 = 0;
    }
  }
  Memory::CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((WriteBarrierPtr<void> *)(pSVar6 + 1),(ulong)pSVar6->size,
             (WriteBarrierPtr<void> *)(pSVar9 + 1),(ulong)TVar10);
  if (failFastError._12_1_ == '\0') {
    pSVar2 = (pSVar9->next).ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar6->next);
    (pSVar6->next).ptr = pSVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar6->next);
  }
  else {
    local_48 = (undefined1  [8])
               ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
    failFastError.m_threadContext._0_1_ = 0;
    failFastError.m_threadContext._1_1_ = 0;
    failFastError.m_threadContext._2_1_ = 1;
    pIVar1 = ((ThreadContext *)local_48)->interruptPoller;
    if (pIVar1 != (InterruptPoller *)0x0) {
      failFastError.m_threadContext._1_1_ = pIVar1->isDisabled;
      failFastError.m_threadContext._0_1_ = 0;
      pIVar1->isDisabled = true;
    }
    while (pSVar2 = (pSVar9->next).ptr, pSVar2 != (SparseArraySegmentBase *)0x0) {
      pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      pSVar9 = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                          (pRVar8,pSVar2->left,pSVar2->length,pSVar2->size,(pSVar2->next).ptr)->
                super_SparseArraySegmentBase;
      addr = &pSVar6->next;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pSVar6 = addr->ptr;
      Memory::
      CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                ((WriteBarrierPtr<void> *)(pSVar6 + 1),(ulong)pSVar6->size,
                 (WriteBarrierPtr<void> *)(pSVar2 + 1),(ulong)pSVar2->size);
      pSVar9 = pSVar2;
    }
    (pSVar6->next).ptr = (SparseArraySegmentBase *)0x0;
    failFastError.m_threadContext._0_1_ = 1;
    AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_48);
  }
  pSVar6 = (((this->head).ptr)->next).ptr;
  if ((pSVar6 != (SparseArraySegmentBase *)0x0) &&
     (failFastError._12_1_ == '\x01' && pSVar6 == (pSVar9->next).ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f2f,
                                "(this->head->next == nullptr || this->head->next != src->next || !deepCopy)"
                                ,
                                "this->head->next == nullptr || this->head->next != src->next || !deepCopy"
                               );
    if (!bVar4) {
LAB_00b9cf8e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void JavascriptArray::InitBoxedInlineSegments(T * instance, bool deepCopy)
    {
        // Don't copy the segment map, we will build it again
        SetFlags(GetFlags() & ~DynamicObjectFlags::HasSegmentMap);

        SparseArraySegment<typename T::TElement>* src = SparseArraySegment<typename T::TElement>::From(instance->head);
        SparseArraySegment<typename T::TElement>* dst;

        uint32 sourceSize = src->size;
        if (IsInlineSegment(src, instance))
        {
            // Copy head segment data between inlined head segments
            dst = DetermineInlineHeadSegmentPointer<T, 0, true>(static_cast<T*>(this));
            dst->left = src->left;
            dst->length = src->length;
            uint inlineChunkSize = SparseArraySegmentBase::INLINE_CHUNK_SIZE;
            dst->size = min(src->size, inlineChunkSize);
            sourceSize = dst->size;
        }
        else
        {
            // Otherwise, ensure that the new head segment is allocated now in the recycler so that the data can be copied.
            // Note: src->next is provided to control whether a leaf segment is allocated just as it is with instance. If
            //  src->next is non-null, the appropriate update to dst->next will continue below.
            dst = SparseArraySegment<typename T::TElement>::AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
        }

        SetHeadAndLastUsedSegment(dst);
        dst->CheckLengthvsSize();

        Assert(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)));

        CopyArray(dst->elements, dst->size, src->elements, sourceSize);

        if (!deepCopy)
        {
            // Without a deep copy, point to the existing next segment from the original instance
            dst->next = src->next;
        }
        else
        {
            // When deepCopy is true, make a separate copy of each segment. While this involves data
            // duplication, it allows the new object to have a separate lifetime without sharing data.
            AutoDisableInterrupt failFastError(GetScriptContext()->GetThreadContext());
            do
            {
                if (src->next != nullptr)
                {
                    // Allocate a new segment in the destination and copy from src
                    // note: PointerValue is to strip SWB wrapping before static_cast
                    src = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(src->next));

                    dst->next = dst->AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
                    dst = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(dst->next));

                    CopyArray(dst->elements, dst->size, src->elements, src->size);
                }
                else
                {
                    // Terminate the loop
                    dst->next = nullptr;
                    dst = nullptr;
                }
            } while (dst != nullptr);
            failFastError.Completed();
        }

        // Assert either
        // - there is only the head segment
        // - the new head segment points to a new next segment
        // - the new head segment points to the existing next segment because this is not a deepCopy
        Assert(this->head->next == nullptr || this->head->next != src->next || !deepCopy);
    }